

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long>
beast::detail::base64::decode<void>(void *dest,char *src,size_t len)

{
  char *pcVar1;
  bool bVar2;
  long local_70;
  long local_68;
  char local_59;
  char *pcStack_58;
  char v;
  char *inverse;
  int j;
  int i;
  uchar c4 [4];
  byte *pbStack_40;
  uchar c3 [3];
  uchar *in;
  char *out;
  size_t len_local;
  char *src_local;
  void *dest_local;
  
  inverse._4_4_ = 0;
  inverse._0_4_ = 0;
  pbStack_40 = (byte *)src;
  pcStack_58 = get_inverse();
  in = (uchar *)dest;
  out = (char *)len;
  while( true ) {
    pcVar1 = out + -1;
    bVar2 = false;
    if (out != (char *)0x0) {
      bVar2 = *pbStack_40 != 0x3d;
    }
    if ((!bVar2) || (local_59 = pcStack_58[*pbStack_40], local_59 == -1)) break;
    pbStack_40 = pbStack_40 + 1;
    *(char *)((long)&j + (long)inverse._4_4_ + 1) = local_59;
    inverse._4_4_ = inverse._4_4_ + 1;
    out = pcVar1;
    if (inverse._4_4_ == 4) {
      i._1_1_ = j._1_1_ * '\x04' + (char)((int)(j._2_1_ & 0x30) >> 4);
      i._2_1_ = j._2_1_ * '\x10' + (char)((int)(j._3_1_ & 0x3c) >> 2);
      i._3_1_ = j._3_1_ * '@' + (char)i;
      for (inverse._4_4_ = 0; inverse._4_4_ < 3; inverse._4_4_ = inverse._4_4_ + 1) {
        *in = *(uchar *)((long)&i + (long)inverse._4_4_ + 1);
        in = in + 1;
      }
      inverse._4_4_ = 0;
    }
  }
  if (inverse._4_4_ != 0) {
    i._1_1_ = j._1_1_ * '\x04' + (char)((int)(j._2_1_ & 0x30) >> 4);
    i._2_1_ = j._2_1_ * '\x10' + (char)((int)(j._3_1_ & 0x3c) >> 2);
    i._3_1_ = j._3_1_ * '@' + (char)i;
    for (inverse._0_4_ = 0; (int)inverse < inverse._4_4_ + -1; inverse._0_4_ = (int)inverse + 1) {
      *in = *(uchar *)((long)&i + (long)(int)inverse + 1);
      in = in + 1;
    }
  }
  local_68 = (long)in - (long)dest;
  local_70 = (long)pbStack_40 - (long)src;
  std::pair<unsigned_long,_unsigned_long>::pair<long,_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)&dest_local,&local_68,&local_70);
  return _dest_local;
}

Assistant:

std::pair<std::size_t, std::size_t>
decode(void* dest, char const* src, std::size_t len)
{
    char* out = static_cast<char*>(dest);
    auto in = reinterpret_cast<unsigned char const*>(src);
    unsigned char c3[3], c4[4];
    int i = 0;
    int j = 0;

    auto const inverse = base64::get_inverse();

    while(len-- && *in != '=')
    {
        auto const v = inverse[*in];
        if(v == -1)
            break;
        ++in;
        c4[i] = v;
        if(++i == 4)
        {
            c3[0] =  (c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
            c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
            c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

            for(i = 0; i < 3; i++)
                *out++ = c3[i];
            i = 0;
        }
    }

    if(i)
    {
        c3[0] = ( c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
        c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
        c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

        for(j = 0; j < i - 1; j++)
            *out++ = c3[j];
    }

    return {out - static_cast<char*>(dest),
        in - reinterpret_cast<unsigned char const*>(src)};
}